

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

pair<mjs::token,_unsigned_long> * __thiscall
mjs::anon_unknown_2::get_identifier
          (pair<mjs::token,_unsigned_long> *__return_storage_ptr__,anon_unknown_2 *this,
          wstring_view text,size_t token_start,version ver)

{
  int *piVar1;
  int ch;
  bool bVar2;
  char cVar3;
  bool bVar4;
  uint uVar5;
  ulong uVar6;
  runtime_error *prVar7;
  anon_unknown_2 *paVar8;
  version ver_00;
  int *piVar9;
  code *pcVar10;
  ulong uVar11;
  bool bVar12;
  wstring id;
  token local_a8;
  token tok;
  undefined4 *local_50;
  undefined8 local_48;
  undefined4 local_40 [4];
  
  ver_00 = (version)token_start;
  paVar8 = (anon_unknown_2 *)text._M_str;
  piVar1 = (int *)(text._M_len + (long)paVar8 * 4);
  bVar12 = *piVar1 == 0x5c;
  pcVar10 = is_identifier_part_v3;
  if (1 < (int)ver_00) {
    pcVar10 = is_identifier_part_v5;
  }
  do {
    piVar9 = (int *)(text._M_len + 4 + (long)paVar8 * 4);
LAB_0015f076:
    paVar8 = paVar8 + 1;
    if (this <= paVar8) {
LAB_0015f0be:
      id._M_dataplus._M_p = (pointer)&id.field_2;
      std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&id,piVar1,piVar9);
      tok.type_ = eof;
      if (bVar12) {
        uVar6 = std::__cxx11::wstring::find((wchar_t)&id,0x5c);
        if (uVar6 == 0xffffffffffffffff) {
          __assert_fail("idx != std::wstring::npos",
                        "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/lexer.cpp"
                        ,0xb8,
                        "std::wstring mjs::(anonymous namespace)::replace_unicode_escape_sequences(const std::wstring &, version)"
                       );
        }
        local_50 = local_40;
        local_48 = 0;
        local_40[0] = 0;
        uVar11 = 0;
        while (uVar6 != 0xffffffffffffffff) {
          if (id._M_dataplus._M_p[uVar6] != L'\\') {
            __assert_fail("id[idx] == \'\\\\\'",
                          "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/lexer.cpp"
                          ,0xbd,
                          "std::wstring mjs::(anonymous namespace)::replace_unicode_escape_sequences(const std::wstring &, version)"
                         );
          }
          if (uVar6 != uVar11) {
            std::__cxx11::wstring::substr((ulong)&local_a8,(ulong)&id);
            std::__cxx11::wstring::append((wstring *)&local_50);
            std::__cxx11::wstring::~wstring((wstring *)&local_a8);
          }
          uVar11 = uVar6 + 6;
          if ((id._M_string_length < uVar11) || ((id._M_dataplus._M_p[uVar6 + 1] | 0x20U) != 0x75))
          {
            prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar7,"Illegal unicode escape sequence in identfier")
            ;
            __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          uVar5 = get_hex_value4(id._M_dataplus._M_p + uVar6 + 2);
          bVar2 = is_identifier_part(uVar5 & 0xffff,ver_00);
          if (!bVar2) {
            prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar7,"Illegal unicode escape sequence in identfier")
            ;
            __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          std::__cxx11::wstring::push_back((wchar_t)(wstring *)&local_50);
          uVar6 = std::__cxx11::wstring::find((wchar_t)&id,0x5c);
        }
        std::__cxx11::wstring::substr((ulong)&local_a8,(ulong)&id);
        std::__cxx11::wstring::append((wstring *)&local_50);
        std::__cxx11::wstring::~wstring((wstring *)&local_a8);
        std::__cxx11::wstring::operator=((wstring *)&id,(wstring *)&local_50);
        std::__cxx11::wstring::~wstring((wstring *)&local_50);
      }
      if (ver_00 == es3) {
        bVar2 = std::operator==(&id,L"abstract");
        if (bVar2) {
          local_a8.type_ = abstract_;
        }
        else {
          bVar2 = std::operator==(&id,L"boolean");
          if (!bVar2) goto LAB_0015f2b1;
          local_a8.type_ = boolean_;
        }
      }
      else if (ver_00 < (es5|es3)) {
LAB_0015f2b1:
        bVar2 = std::operator==(&id,L"break");
        if (bVar2) {
          local_a8.type_ = break_;
        }
        else if ((ver_00 == es3) && (bVar2 = std::operator==(&id,L"byte"), bVar2)) {
          local_a8.type_ = byte_;
        }
        else {
          bVar2 = std::operator==(&id,L"case");
          if (bVar2) {
            local_a8.type_ = case_;
          }
          else {
            bVar2 = std::operator==(&id,L"catch");
            if (bVar2) {
              local_a8.type_ = catch_;
            }
            else if ((ver_00 == es3) && (bVar2 = std::operator==(&id,L"char"), bVar2)) {
              local_a8.type_ = char_;
            }
            else {
              bVar2 = std::operator==(&id,L"class");
              if (bVar2) {
                local_a8.type_ = class_;
              }
              else {
                bVar2 = std::operator==(&id,L"const");
                if (bVar2) {
                  local_a8.type_ = const_;
                }
                else {
                  bVar2 = std::operator==(&id,L"continue");
                  if (bVar2) {
                    local_a8.type_ = continue_;
                  }
                  else {
                    bVar2 = std::operator==(&id,L"debugger");
                    if (bVar2) {
                      local_a8.type_ = debugger_;
                    }
                    else {
                      bVar2 = std::operator==(&id,L"default");
                      if (bVar2) {
                        local_a8.type_ = default_;
                      }
                      else {
                        bVar2 = std::operator==(&id,L"delete");
                        if (bVar2) {
                          local_a8.type_ = delete_;
                        }
                        else {
                          bVar2 = std::operator==(&id,L"do");
                          if (bVar2) {
                            local_a8.type_ = do_;
                          }
                          else if ((ver_00 == es3) &&
                                  (bVar2 = std::operator==(&id,L"double"), bVar2)) {
                            local_a8.type_ = double_;
                          }
                          else {
                            bVar2 = std::operator==(&id,L"else");
                            if (!bVar2) {
                              bVar2 = std::operator==(&id,L"enum");
                              if (bVar2) {
                                local_a8.type_ = enum_;
                              }
                              else {
                                bVar2 = std::operator==(&id,L"export");
                                if (bVar2) {
                                  local_a8.type_ = export_;
                                }
                                else {
                                  bVar2 = std::operator==(&id,L"extends");
                                  if (bVar2) {
                                    local_a8.type_ = extends_;
                                  }
                                  else {
                                    bVar2 = std::operator==(&id,L"false");
                                    if (bVar2) {
                                      local_a8.type_ = false_;
                                    }
                                    else if ((ver_00 == es3) &&
                                            (bVar2 = std::operator==(&id,L"final"), bVar2)) {
                                      local_a8.type_ = final_;
                                    }
                                    else {
                                      bVar2 = std::operator==(&id,L"finally");
                                      if (bVar2) {
                                        local_a8.type_ = finally_;
                                      }
                                      else if ((ver_00 == es3) &&
                                              (bVar2 = std::operator==(&id,L"float"), bVar2)) {
                                        local_a8.type_ = float_;
                                      }
                                      else {
                                        bVar2 = std::operator==(&id,L"for");
                                        if (bVar2) {
                                          local_a8.type_ = for_;
                                        }
                                        else {
                                          bVar2 = std::operator==(&id,L"function");
                                          if (bVar2) {
                                            local_a8.type_ = function_;
                                          }
                                          else if ((ver_00 == es3) &&
                                                  (bVar2 = std::operator==(&id,L"goto"), bVar2)) {
                                            local_a8.type_ = goto_;
                                          }
                                          else {
                                            bVar2 = std::operator==(&id,L"if");
                                            if (bVar2) {
                                              local_a8.type_ = if_;
                                            }
                                            else {
                                              uVar5 = ver_00 - es3;
                                              if ((uVar5 < 2) &&
                                                 (bVar2 = std::operator==(&id,L"implements"), bVar2)
                                                 ) {
                                                local_a8.type_ = implements_;
                                              }
                                              else {
                                                bVar2 = std::operator==(&id,L"import");
                                                if (bVar2) {
                                                  local_a8.type_ = import_;
                                                }
                                                else {
                                                  bVar2 = std::operator==(&id,L"in");
                                                  if (bVar2) {
                                                    local_a8.type_ = in_;
                                                  }
                                                  else if (uVar5 < 2) {
                                                    bVar2 = std::operator==(&id,L"instanceof");
                                                    if (bVar2) {
                                                      local_a8.type_ = instanceof_;
                                                    }
                                                    else if ((ver_00 == es3) &&
                                                            (bVar2 = std::operator==(&id,L"int"),
                                                            bVar2)) {
                                                      local_a8.type_ = int_;
                                                    }
                                                    else {
                                                      bVar2 = std::operator==(&id,L"interface");
                                                      if (bVar2) {
                                                        local_a8.type_ = interface_;
                                                      }
                                                      else if (ver_00 == es5) {
                                                        bVar4 = std::operator==(&id,L"let");
                                                        bVar2 = true;
                                                        if (!bVar4) goto LAB_0015f917;
                                                        local_a8.type_ = let_;
                                                      }
                                                      else {
                                                        bVar2 = std::operator==(&id,L"long");
                                                        if (bVar2) {
                                                          local_a8.type_ = long_;
                                                        }
                                                        else {
                                                          bVar2 = std::operator==(&id,L"native");
                                                          if (!bVar2) goto LAB_0015f915;
                                                          local_a8.type_ = native_;
                                                        }
                                                      }
                                                    }
                                                  }
                                                  else {
LAB_0015f915:
                                                    bVar2 = false;
LAB_0015f917:
                                                    bVar4 = std::operator==(&id,L"new");
                                                    if (bVar4) {
                                                      local_a8.type_ = new_;
                                                    }
                                                    else {
                                                      bVar4 = std::operator==(&id,L"null");
                                                      if (bVar4) {
                                                        local_a8.type_ = null_;
                                                      }
                                                      else if (uVar5 < 2) {
                                                        bVar4 = std::operator==(&id,L"package");
                                                        if (bVar4) {
                                                          local_a8.type_ = package_;
                                                        }
                                                        else {
                                                          bVar4 = std::operator==(&id,L"private");
                                                          if (bVar4) {
                                                            local_a8.type_ = private_;
                                                          }
                                                          else {
                                                            bVar4 = std::operator==(&id,L"protected"
                                                                                   );
                                                            if (bVar4) {
                                                              local_a8.type_ = protected_;
                                                            }
                                                            else {
                                                              bVar4 = std::operator==(&id,L"public")
                                                              ;
                                                              if (!bVar4) goto LAB_0015f9fe;
                                                              local_a8.type_ = public_;
                                                            }
                                                          }
                                                        }
                                                      }
                                                      else {
LAB_0015f9fe:
                                                        bVar4 = std::operator==(&id,L"return");
                                                        if (bVar4) {
                                                          local_a8.type_ = return_;
                                                        }
                                                        else if (ver_00 == es3) {
                                                          bVar4 = std::operator==(&id,L"short");
                                                          if (!bVar4) goto LAB_0015fa54;
                                                          local_a8.type_ = short_;
                                                        }
                                                        else {
                                                          if (uVar5 < 2) {
LAB_0015fa54:
                                                            bVar4 = std::operator==(&id,L"static");
                                                            if (bVar4) {
                                                              local_a8.type_ = static_;
                                                              goto LAB_0015fcab;
                                                            }
                                                          }
                                                          bVar4 = std::operator==(&id,L"super");
                                                          if (bVar4) {
                                                            local_a8.type_ = super_;
                                                          }
                                                          else {
                                                            bVar4 = std::operator==(&id,L"switch");
                                                            if (bVar4) {
                                                              local_a8.type_ = switch_;
                                                            }
                                                            else if ((ver_00 == es3) &&
                                                                    (bVar4 = std::operator==(&id,
                                                  L"synchronized"), bVar4)) {
                                                    local_a8.type_ = synchronized_;
                                                  }
                                                  else {
                                                    bVar4 = std::operator==(&id,L"this");
                                                    if (bVar4) {
                                                      local_a8.type_ = this_;
                                                    }
                                                    else {
                                                      bVar4 = std::operator==(&id,L"throw");
                                                      if (bVar4) {
                                                        local_a8.type_ = throw_;
                                                      }
                                                      else if (ver_00 == es3) {
                                                        bVar4 = std::operator==(&id,L"throws");
                                                        if (bVar4) {
                                                          local_a8.type_ = throws_;
                                                        }
                                                        else {
                                                          bVar4 = std::operator==(&id,L"transient");
                                                          if (!bVar4) goto LAB_0015fb8a;
                                                          local_a8.type_ = transient_;
                                                        }
                                                      }
                                                      else {
LAB_0015fb8a:
                                                        bVar4 = std::operator==(&id,L"true");
                                                        if (bVar4) {
                                                          local_a8.type_ = true_;
                                                        }
                                                        else {
                                                          bVar4 = std::operator==(&id,L"try");
                                                          if (bVar4) {
                                                            local_a8.type_ = try_;
                                                          }
                                                          else {
                                                            bVar4 = std::operator==(&id,L"typeof");
                                                            if (bVar4) {
                                                              local_a8.type_ = typeof_;
                                                            }
                                                            else {
                                                              bVar4 = std::operator==(&id,L"var");
                                                              if (bVar4) {
                                                                local_a8.type_ = var_;
                                                              }
                                                              else {
                                                                bVar4 = std::operator==(&id,L"void")
                                                                ;
                                                                if (bVar4) {
                                                                  local_a8.type_ = void_;
                                                                }
                                                                else if ((ver_00 == es3) &&
                                                                        (bVar4 = std::operator==(&id
                                                  ,L"volatile"), bVar4)) {
                                                    local_a8.type_ = volatile_;
                                                  }
                                                  else {
                                                    bVar4 = std::operator==(&id,L"while");
                                                    if (bVar4) {
                                                      local_a8.type_ = while_;
                                                    }
                                                    else {
                                                      bVar4 = std::operator==(&id,L"with");
                                                      if (!bVar4) {
                                                        if ((!bVar2) ||
                                                           (bVar2 = std::operator==(&id,L"yield"),
                                                           !bVar2)) goto LAB_0015f26b;
                                                        local_a8.type_ = yield_;
                                                        goto LAB_0015f4bd;
                                                      }
                                                      local_a8.type_ = with_;
                                                    }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
LAB_0015fcab:
                              token::operator=(&tok,&local_a8);
                              token::~token(&local_a8);
                              goto LAB_0015f4cd;
                            }
                            local_a8.type_ = else_;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      else {
LAB_0015f26b:
        token::token(&local_a8,identifier,&id);
      }
LAB_0015f4bd:
      token::operator=(&tok,&local_a8);
      token::~token(&local_a8);
LAB_0015f4cd:
      if ((bool)(bVar12 & tok.type_ != identifier)) {
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar7,"Unicode escape sequence used in keyword");
        __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      token::token(&__return_storage_ptr__->first,&tok);
      __return_storage_ptr__->second = (unsigned_long)paVar8;
      token::~token(&tok);
      std::__cxx11::wstring::~wstring((wstring *)&id);
      return __return_storage_ptr__;
    }
    ch = *piVar9;
    bVar2 = is_identifier_part_v1(ch);
    if (bVar2) {
LAB_0015f0a4:
      piVar9 = piVar9 + 1;
      goto LAB_0015f076;
    }
    if ((int)ver_00 < 1) goto LAB_0015f0be;
    if (ch != 0x5c) {
      cVar3 = (*pcVar10)(ch);
      if (cVar3 != '\0') goto LAB_0015f0a4;
      goto LAB_0015f0be;
    }
    bVar12 = true;
  } while( true );
}

Assistant:

std::pair<token, size_t> get_identifier(const std::wstring_view text, const size_t token_start, version ver) {
    auto token_end = token_start + 1;
    bool escape_sequence_used = text[token_start] == '\\';

    const auto exended_id_part = ver >= version::es5 ? is_identifier_part_v5 : is_identifier_part_v3;

    for (; token_end < text.size(); ++token_end) {
        const int ch = text[token_end];
        if (is_identifier_part_v1(ch)) {
            // OK - fast path
        } else if (ver < version::es3) {
            break;
        } else if (ch == '\\') {
            escape_sequence_used = true;
        } else if (!exended_id_part(ch)) {
            break;
        }
    }
    auto id = std::wstring{text.begin() + token_start, text.begin() + token_end};
    token tok{token_type::eof};
    if (escape_sequence_used) {
        id = replace_unicode_escape_sequences(id, ver);
    }
    if (0) {}
#define X(rw, first_ver, last_ver) else if (ver >= version::first_ver && ver <= version::last_ver && id == L ## #rw) { tok = token{token_type::rw ## _}; }
    MJS_KEYWORDS(X)
#undef X
else tok = token{token_type::identifier, id};

    if (escape_sequence_used && tok.type() != token_type::identifier) {
        throw std::runtime_error("Unicode escape sequence used in keyword");
    }

    return { tok, token_end };
}